

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOFunction.cpp
# Opt level: O3

void PSOAdaption(Particle *particle,myRep *rep,double w,int it)

{
  double **p2;
  uint n;
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  
  n = particle->sizeOfPosition;
  iVar4 = rouletteWheel(rep);
  p2 = &particle->Position;
  cpyDoubleArray(&particle->old_position,p2,n);
  dVar3 = c2;
  dVar2 = c1;
  iVar5 = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  iVar5 = iVar5 + 1;
  do {
    rep = (myRep *)(((_List_base<Rep,_std::allocator<Rep>_> *)&((_List_node_base *)rep)->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  if ((int)n < 1) {
    checkV(&particle->Velocity,particle->sizeOfVelocity);
  }
  else {
    uVar8 = 0;
    do {
      iVar5 = rand();
      iVar4 = rand();
      if ((it == 0) && ((int)(uVar8 / 3) * 3 + 1 != (int)uVar8)) {
        iVar6 = rand();
        dVar9 = (double)iVar6 / 2147483647.0;
        pdVar7 = particle->Velocity;
        pdVar7[uVar8] = dVar9;
      }
      else {
        pdVar7 = particle->Velocity;
        dVar9 = pdVar7[uVar8];
      }
      pdVar7[uVar8] =
           (*(double *)((long)((_List_node_base *)((long)rep + 0x20))->_M_next + uVar8 * 8) -
           particle->Position[uVar8]) * ((double)iVar4 / 2147483647.0) * dVar3 +
           dVar9 * w +
           ((particle->Best).Position[uVar8] - particle->Position[uVar8]) *
           ((double)iVar5 / 2147483647.0) * dVar2;
      uVar8 = uVar8 + 1;
    } while (n != uVar8);
    checkV(&particle->Velocity,particle->sizeOfVelocity);
    if (0 < (int)n) {
      pdVar7 = particle->Velocity;
      pdVar1 = *p2;
      uVar8 = 0;
      do {
        pdVar1[uVar8] = pdVar7[uVar8] + pdVar1[uVar8];
        uVar8 = uVar8 + 1;
      } while (n != uVar8);
    }
  }
  checkP(p2,&particle->Velocity,particle->sizeOfPosition);
  return;
}

Assistant:

void PSOAdaption(Particle & particle, myRep & rep, double w, int it) {
    int len = particle.sizeOfPosition;
    int h = rouletteWheel(rep);
    cpyDoubleArray(particle.old_position, particle.Position, len);
    myRep ::iterator a = rep.begin();
    for (int i=0; i<h; i++) a++;
    //  calculate the new Velocity
    for (int i=0; i<len; i++){
        double r1 = rand() / double(RAND_MAX) , r2 = rand() / double(RAND_MAX) ;
        //double r1=0.7, r2=0.7;
        if(it==0 && i%3 != 1) particle.Velocity[i] = rand() / double(RAND_MAX);
        //if(it==0 && i%3 != 1) particle.Velocity[i] = 0.7;
        particle.Velocity[i] = w * particle.Velocity[i] +
                               c1*r1* (particle.Best.Position[i] - particle.Position[i]) +
                               c2*r2 * (a->Position[i] - particle.Position[i]);
    }

    checkV(particle.Velocity, particle.sizeOfVelocity);

    //  calculate the new position
    for (int i=0; i<len; i++)   particle.Position[i] += particle.Velocity[i];

    checkP(particle.Position, particle.Velocity, particle.sizeOfPosition);
}